

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O2

void __thiscall
Ronan::syWRonan::SetFrame(syWRonan *this,Phoneme *p1s,Phoneme *p2s,float x,syVRonan *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  syVRonan *this_00;
  float gain;
  float fVar6;
  Phoneme p2;
  Phoneme p1;
  float *p2a [7];
  float *p2b [7];
  float *p2f [7];
  float *p1a [7];
  float *p1b [7];
  float *p1f [7];
  
  p1f[0] = &p1.fnf;
  p1f[1] = &p1.f1f;
  p1f[2] = &p1.f2f;
  p1f[3] = &p1.f3f;
  p1f[4] = (float *)&f4;
  p1f[5] = (float *)&f5;
  p1f[6] = (float *)&f6;
  p1b[0] = (float *)&bn;
  p1b[1] = &p1.f1b;
  p1b[2] = &p1.f2b;
  p1b[3] = &p1.f3b;
  p1b[4] = (float *)&b4;
  p1b[5] = (float *)&b5;
  p1b[6] = (float *)&b6;
  p1a[0] = &p1.a_n;
  p1a[1] = &p1.a_1;
  p1a[2] = &p1.a_2;
  p1a[3] = &p1.a_3;
  p1a[4] = &p1.a_4;
  p1a[5] = &p1.a_56;
  p2f[0] = &p2.fnf;
  p2f[2] = &p2.f2f;
  p2f[3] = &p2.f3f;
  p2f[4] = (float *)&f4;
  p2f[5] = (float *)&f5;
  p2f[6] = (float *)&f6;
  p2b[0] = (float *)&bn;
  p2b[1] = &p2.f1b;
  p2b[2] = &p2.f2b;
  p2b[3] = &p2.f3b;
  p2b[4] = (float *)&b4;
  p2b[5] = (float *)&b5;
  p2b[6] = (float *)&b6;
  p2a[0] = &p2.a_n;
  p2a[1] = &p2.a_1;
  p2a[2] = &p2.a_2;
  p2a[3] = &p2.a_3;
  p2a[4] = &p2.a_4;
  p2a[5] = &p2.a_56;
  p2a[6] = p2a[5];
  p2f[1] = &p2.f1f;
  p1a[6] = p1a[5];
  memcpy(p1f[1],p1s,0x4c);
  memcpy(&p2,p2s,0x4c);
  this_00 = dest;
  for (lVar5 = 0; lVar5 != 0x38; lVar5 = lVar5 + 8) {
    fVar6 = **(float **)((long)p1f + lVar5);
    fVar1 = **(float **)((long)p2f + lVar5);
    fVar2 = this->pitch;
    fVar3 = **(float **)((long)p1b + lVar5);
    fVar4 = **(float **)((long)p2b + lVar5);
    gain = exp2f(((**(float **)((long)p2a + lVar5) - **(float **)((long)p1a + lVar5)) * x +
                  **(float **)((long)p1a + lVar5) + -70.0) / 6.0);
    ResDef::set(this_00->rdef,((fVar1 - fVar6) * x + fVar6) * fVar2,(fVar4 - fVar3) * x + fVar3,gain
               );
    this_00 = (syVRonan *)(this_00->rdef + 1);
  }
  fVar6 = exp2f(((p2.a_voicing - p1.a_voicing) * x + p1.a_voicing + -70.0) / 6.0);
  dest->a_voicing = fVar6;
  fVar6 = exp2f(((p2.a_aspiration - p1.a_aspiration) * x + p1.a_aspiration + -70.0) / 6.0);
  dest->a_aspiration = fVar6;
  fVar6 = exp2f(((p2.a_frication - p1.a_frication) * x + p1.a_frication + -70.0) / 6.0);
  dest->a_frication = fVar6;
  fVar6 = exp2f(((p2.a_bypass - p1.a_bypass) * x + p1.a_bypass + -70.0) / 6.0);
  dest->a_bypass = fVar6;
  return;
}

Assistant:

void SetFrame(const Phoneme &p1s, const Phoneme &p2s, const float x, syVRonan &dest)
    {
        Phoneme p1,p2;

        const float * const p1f[] = { &p1.fnf, &p1.f1f, &p1.f2f, &p1.f3f, &f4    , &f5     , &f6};
        const float * const p1b[] = { &bn    , &p1.f1b, &p1.f2b, &p1.f3b, &b4    , &b5     , &b6};
        const float * const p1a[] = { &p1.a_n, &p1.a_1, &p1.a_2, &p1.a_3, &p1.a_4, &p1.a_56, &p1.a_56};

        const float * const p2f[] = { &p2.fnf, &p2.f1f, &p2.f2f, &p2.f3f, &f4    , &f5     , &f6};
        const float * const p2b[] = { &bn    , &p2.f1b, &p2.f2b, &p2.f3b, &b4    , &b5     , &b6};
        const float * const p2a[] = { &p2.a_n, &p2.a_1, &p2.a_2, &p2.a_3, &p2.a_4, &p2.a_56, &p2.a_56};

        p1 = p1s;
        p2 = p2s;

        for (int i = 0; i < 7; i++)
            dest.rdef[i].set(flerp(*p1f[i], *p2f[i], x)*pitch, flerp(*p1b[i], *p2b[i], x), db2lin(*p1a[i], *p2a[i], x));

        dest.a_voicing    = db2lin(p1.a_voicing, p2.a_voicing, x);
        dest.a_aspiration = db2lin(p1.a_aspiration, p2.a_aspiration, x);
        dest.a_frication  = db2lin(p1.a_frication, p2.a_frication, x);
        dest.a_bypass     = db2lin(p1.a_bypass, p2.a_bypass, x);
    }